

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O1

int stb_vorbis_get_samples_short(stb_vorbis *f,int channels,short **buffer,int len)

{
  int iVar1;
  int iVar2;
  int b_offset;
  float **outputs;
  float **local_38;
  
  b_offset = 0;
  while( true ) {
    if (len - b_offset == 0 || len < b_offset) {
      return b_offset;
    }
    iVar1 = f->channel_buffer_end - f->channel_buffer_start;
    iVar2 = len - b_offset;
    if (iVar1 + b_offset < len) {
      iVar2 = iVar1;
    }
    if (iVar2 != 0) {
      convert_samples_short
                (channels,buffer,b_offset,f->channels,f->channel_buffers,f->channel_buffer_start,
                 iVar2);
    }
    b_offset = b_offset + iVar2;
    f->channel_buffer_start = f->channel_buffer_start + iVar2;
    if (b_offset == len) break;
    iVar2 = stb_vorbis_get_frame_float(f,(int *)0x0,&local_38);
    if (iVar2 == 0) {
      return b_offset;
    }
  }
  return b_offset;
}

Assistant:

int stb_vorbis_get_samples_short(stb_vorbis *f, int channels, short **buffer, int len)
{
   float **outputs;
   int n=0;
   while (n < len) {
      int k = f->channel_buffer_end - f->channel_buffer_start;
      if (n+k >= len) k = len - n;
      if (k)
         convert_samples_short(channels, buffer, n, f->channels, f->channel_buffers, f->channel_buffer_start, k);
      n += k;
      f->channel_buffer_start += k;
      if (n == len) break;
      if (!stb_vorbis_get_frame_float(f, NULL, &outputs)) break;
   }
   return n;
}